

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::WriteToMultipleSSBOTest::initPrograms
          (WriteToMultipleSSBOTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  ostringstream src;
  allocator<char> local_20b;
  allocator<char> local_20a;
  allocator<char> local_209;
  string local_208;
  undefined1 local_1e8 [40];
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[0]);
  poVar1 = std::operator<<(poVar1,", local_size_y = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
  poVar1 = std::operator<<(poVar1,", local_size_z = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
  poVar1 = std::operator<<(poVar1,") in;\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 0) writeonly buffer Out0 {\n");
  poVar1 = std::operator<<(poVar1,"    uint values[");
  if (this->m_sized == true) {
    de::toString<unsigned_int>((string *)local_1e8,&this->m_numValues);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1e8,"",&local_209);
  }
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_out0;\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 1) writeonly buffer Out1 {\n");
  poVar1 = std::operator<<(poVar1,"    uint values[");
  if (this->m_sized == true) {
    de::toString<unsigned_int>(&local_208,&this->m_numValues);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_20a);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_out1;\n");
  poVar1 = std::operator<<(poVar1,"void main (void) {\n");
  poVar1 = std::operator<<(poVar1,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar1 = std::operator<<(poVar1,
                           "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"    {\n");
  poVar1 = std::operator<<(poVar1,
                           "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar1 = std::operator<<(poVar1,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar1 = std::operator<<(poVar1,"            sb_out0.values[offset + ndx] = offset + ndx;\n");
  poVar1 = std::operator<<(poVar1,"    }\n");
  poVar1 = std::operator<<(poVar1,"    {\n");
  poVar1 = std::operator<<(poVar1,
                           "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar1 = std::operator<<(poVar1,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar1 = std::operator<<(poVar1,
                           "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
                          );
  poVar1 = std::operator<<(poVar1,"    }\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"comp",&local_20b);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1e8,&local_1c0);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1e8);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void WriteToMultipleSSBOTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) writeonly buffer Out0 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out0;\n"
		<< "layout(binding = 1) writeonly buffer Out1 {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_out1;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
		<< "    }\n"
		<< "    {\n"
		<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
		<< "        uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
		<< "    }\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}